

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int gpioSetISRFunc(uint gpio,uint edge,int timeout,gpioISRFunc_t f)

{
  FILE *__stream;
  int iVar1;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: gpio=%d edge=%d timeout=%d function=%08X\n",myTimeStamp::buf,
            "gpioSetISRFunc",gpio,edge,(ulong)(uint)timeout,f);
  }
  if (libInitialised == '\0') {
    iVar1 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSetISRFunc_cold_1();
    }
  }
  else if (gpio < 0x36) {
    if (edge < 3) {
      iVar1 = intGpioSetISRFunc(gpio,edge,timeout,f,0,(void *)0x0);
      return iVar1;
    }
    iVar1 = -0x7a;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSetISRFunc_cold_2();
    }
  }
  else {
    iVar1 = -3;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSetISRFunc_cold_3();
    }
  }
  return iVar1;
}

Assistant:

int gpioSetISRFunc(
   unsigned gpio,
   unsigned edge,
   int timeout,
   gpioISRFunc_t f)
{
   DBG(DBG_USER, "gpio=%d edge=%d timeout=%d function=%08X",
      gpio, edge, timeout, (uint32_t)f);

   CHECK_INITED;

   if (gpio > PI_MAX_GPIO)
      SOFT_ERROR(PI_BAD_GPIO, "bad gpio (%d)", gpio);

   if (edge > EITHER_EDGE)
      SOFT_ERROR(PI_BAD_EDGE, "bad ISR edge (%d)", edge);

   return intGpioSetISRFunc(gpio, edge, timeout, f, 0, NULL);
}